

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O2

void __thiscall
CppWebSpider::response::response
          (response *this,string *host,string *uri,string *content,CookieJar *cookie)

{
  allocator local_59;
  string *local_58;
  string local_50;
  
  this->status_code = -1;
  local_58 = &this->protocol;
  std::__cxx11::string::string((string *)local_58,"",&local_59);
  std::__cxx11::string::string((string *)&this->host,(string *)host);
  std::__cxx11::string::string((string *)&this->uri,(string *)uri);
  std::__cxx11::string::string((string *)&this->content,"",&local_59);
  *(undefined8 *)&(this->headers)._M_h._M_rehash_policy = 0;
  (this->headers)._M_h._M_buckets = &(this->headers)._M_h._M_single_bucket;
  (this->headers)._M_h._M_bucket_count = 1;
  (this->headers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->headers)._M_h._M_element_count = 0;
  (this->headers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->headers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->headers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (content->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)content);
    parse(this,&local_50,cookie);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

response(std::string host,std::string uri,std::string content,CookieJar *cookie):status_code(-1),
														protocol(""),
														host(host),
														uri(uri),
														content(""),
														headers(std::unordered_map<std::string,std::string>())
		{
			//假如爬虫返回的原始的的http数据不为空才parse
			if(content.size()!=0)
				parse(content,cookie);
		}